

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

string * spoof_hex_encoded_namespaces(string *arg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong in_RSI;
  char cVar5;
  string *in_RDI;
  uchar c;
  char *p;
  string substr;
  int pos;
  string *res;
  char *local_50 [3];
  string local_38 [32];
  int local_18;
  undefined1 local_11;
  ulong local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_18 = 0;
  while( true ) {
    iVar1 = local_18;
    iVar2 = std::__cxx11::string::size();
    cVar5 = (char)in_RDI;
    if (iVar2 + -3 <= iVar1) break;
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    if ((*pcVar3 == '\\') &&
       (pcVar3 = (char *)std::__cxx11::string::operator[](local_10), *pcVar3 == 'x')) {
      std::__cxx11::string::substr((ulong)local_38,local_10);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      strtoul(pcVar3,local_50,0x10);
      if (*local_50[0] == '\0') {
        std::__cxx11::string::push_back(cVar5);
        local_18 = local_18 + 4;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Possibly malformed hex representation of a namespace: \'\\x");
        poVar4 = std::operator<<(poVar4,local_38);
        std::operator<<(poVar4,"\'\n");
        local_18 = local_18 + 1;
        std::__cxx11::string::operator[](local_10);
        std::__cxx11::string::push_back(cVar5);
      }
      std::__cxx11::string::~string(local_38);
    }
    else {
      local_18 = local_18 + 1;
      std::__cxx11::string::operator[](local_10);
      std::__cxx11::string::push_back(cVar5);
    }
  }
  while (iVar1 = local_18, iVar2 = std::__cxx11::string::size(), iVar1 < iVar2) {
    local_18 = local_18 + 1;
    std::__cxx11::string::operator[](local_10);
    std::__cxx11::string::push_back(cVar5);
  }
  return in_RDI;
}

Assistant:

string spoof_hex_encoded_namespaces(const string& arg)
{
  string res;
  int pos = 0;
  while (pos < (int)arg.size() - 3)
  {
    if (arg[pos] == '\\' && arg[pos + 1] == 'x')
    {
      string substr = arg.substr(pos + 2, 2);
      char* p;
      unsigned char c = (unsigned char)strtoul(substr.c_str(), &p, 16);
      if (*p == '\0')
      {
        res.push_back(c);
        pos += 4;
      }
      else
      {
        cerr << "Possibly malformed hex representation of a namespace: '\\x" << substr << "'\n";
        res.push_back(arg[pos++]);
      }
    }
    else
      res.push_back(arg[pos++]);
  }

  while (pos < (int)arg.size())  // copy last 2 characters
    res.push_back(arg[pos++]);

  return res;
}